

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReaderAnySize(ListReader *__return_storage_ptr__,OrphanBuilder *this)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  ushort uVar3;
  StructDataBitCount SVar4;
  CapTableReader *pCVar5;
  word *pwVar6;
  Arena *pAVar7;
  ReadLimiter *pRVar8;
  ulong uVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar12;
  SegmentBuilder **ppSVar13;
  uint uVar14;
  SegmentBuilder *pSVar15;
  ulong uVar16;
  ElementSize EVar17;
  uint uVar18;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  Fault f;
  SegmentBuilder *pSVar11;
  
  uVar14 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && uVar14 == 0) goto LAB_001f2210;
  pSVar11 = this->segment;
  pCVar5 = &this->capTable->super_CapTableReader;
  ppSVar13 = (SegmentBuilder **)this->location;
  if (pSVar11 == (SegmentBuilder *)0x0) {
    pSVar11 = (SegmentBuilder *)0x0;
LAB_001f204e:
    if (ppSVar13 == (SegmentBuilder **)0x0) goto LAB_001f2210;
LAB_001f205a:
    uVar14 = (uint)(this->tag).content;
LAB_001f205e:
    if ((uVar14 & 3) == 1) {
      uVar14 = *(uint *)((long)&(this->tag).content + 4);
      EVar17 = (ElementSize)uVar14 & INLINE_COMPOSITE;
      if (EVar17 == INLINE_COMPOSITE) {
        uVar14 = uVar14 >> 3;
        if (pSVar11 == (SegmentBuilder *)0x0) {
LAB_001f20bc:
          if ((*(uint *)ppSVar13 & 3) == 0) {
            uVar18 = *(uint *)ppSVar13 >> 2 & 0x1fffffff;
            uVar16 = (ulong)uVar18;
            uVar2 = *(ushort *)((long)ppSVar13 + 4);
            uVar3 = *(ushort *)((long)ppSVar13 + 6);
            uVar22 = (uint)uVar3 + (uint)uVar2;
            if (uVar22 * uVar16 < (ulong)uVar14 || uVar22 * uVar16 - (ulong)uVar14 == 0) {
              pSVar15 = (SegmentBuilder *)0x0;
              if (uVar22 != 0) {
                pSVar15 = pSVar11;
              }
              if ((pSVar11 != (SegmentBuilder *)0x0) && (uVar22 == 0)) {
                pRVar8 = (pSVar11->super_SegmentReader).readLimiter;
                uVar12 = pRVar8->limit;
                if (uVar12 < uVar16) {
                  (*((pSVar11->super_SegmentReader).arena)->_vptr_Arena[3])();
                  pcVar20 = "amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))";
                  iVar10 = 0x8f2;
LAB_001f24da:
                  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                            (&f,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                             ,iVar10,FAILED,pcVar20,"\"Message contains amplified list pointer.\"",
                             (char (*) [41])"Message contains amplified list pointer.");
                  goto LAB_001f2208;
                }
                pRVar8->limit = uVar12 - uVar16;
                pSVar15 = pSVar11;
              }
              __return_storage_ptr__->segment = &pSVar15->super_SegmentReader;
              __return_storage_ptr__->capTable = pCVar5;
              __return_storage_ptr__->ptr = (byte *)(ppSVar13 + 1);
              __return_storage_ptr__->elementCount = uVar18;
              __return_storage_ptr__->step = uVar22 * 0x40;
              __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
              __return_storage_ptr__->structPointerCount = uVar3;
              __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_001f2250:
              __return_storage_ptr__->nestingLimit = 0x7ffffffe;
              return __return_storage_ptr__;
            }
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x8ea,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount",
                       "\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                       (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.");
          }
          else {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x8e2,FAILED,"tag->kind() == WirePointer::STRUCT",
                       "\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\"",
                       (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported."
                      );
          }
        }
        else {
          if (((long)ppSVar13 - (long)(pSVar11->super_SegmentReader).ptr.ptr >> 3) + (ulong)uVar14 +
              1 <= (pSVar11->super_SegmentReader).ptr.size_) {
            uVar16 = (ulong)uVar14 + 1;
            pRVar8 = (pSVar11->super_SegmentReader).readLimiter;
            uVar12 = pRVar8->limit;
            if (uVar16 <= uVar12) {
              pRVar8->limit = uVar12 - uVar16;
              goto LAB_001f20bc;
            }
            (*((pSVar11->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          pcVar20 = "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)";
          iVar10 = 0x8db;
LAB_001f23f1:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar10,FAILED,pcVar20,"\"Message contains out-of-bounds list pointer.\"",
                     (char (*) [45])"Message contains out-of-bounds list pointer.");
        }
      }
      else {
        SVar4 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar14 & 7) * 4);
        uVar16 = (ulong)(uVar14 >> 3);
        uVar18 = (uint)(EVar17 == POINTER) * 0x40 + SVar4;
        if (pSVar11 != (SegmentBuilder *)0x0) {
          uVar12 = uVar18 * uVar16 + 0x3f >> 6 & 0xffffffff;
          if (((long)ppSVar13 - (long)(pSVar11->super_SegmentReader).ptr.ptr >> 3) + uVar12 <=
              (pSVar11->super_SegmentReader).ptr.size_) {
            pAVar7 = (pSVar11->super_SegmentReader).arena;
            pRVar8 = (pSVar11->super_SegmentReader).readLimiter;
            if (uVar12 <= pRVar8->limit) {
              pRVar8->limit = pRVar8->limit - uVar12;
              if (EVar17 == BIT) goto LAB_001f21d8;
              if ((int)((ulong)uVar14 & 7) == 0) {
                if (pRVar8->limit < uVar16) {
                  (*pAVar7->_vptr_Arena[3])();
                  pcVar20 = "amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))";
                  iVar10 = 0x93c;
                  goto LAB_001f24da;
                }
                pRVar8->limit = pRVar8->limit - uVar16;
              }
LAB_001f2228:
              __return_storage_ptr__->segment = &pSVar11->super_SegmentReader;
              __return_storage_ptr__->capTable = pCVar5;
              __return_storage_ptr__->ptr = (byte *)ppSVar13;
              __return_storage_ptr__->elementCount = uVar14 >> 3;
              __return_storage_ptr__->step = uVar18;
              __return_storage_ptr__->structDataSize = SVar4;
              __return_storage_ptr__->structPointerCount = (ushort)(EVar17 == POINTER);
              __return_storage_ptr__->elementSize = EVar17;
              goto LAB_001f2250;
            }
            (*pAVar7->_vptr_Arena[3])();
          }
          pcVar20 = "boundsCheck(segment, ptr, wordCount)";
          iVar10 = 0x934;
          goto LAB_001f23f1;
        }
        if (EVar17 != BIT) goto LAB_001f2228;
LAB_001f21d8:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x945,FAILED,(char *)0x0,
                   "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                   ,(char (*) [106])
                    "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                  );
      }
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[67]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8cf,FAILED,"ref->kind() == WirePointer::LIST",
                 "\"Message contains non-list pointer where list pointer was expected.\"",
                 (char (*) [67])"Message contains non-list pointer where list pointer was expected."
                );
    }
  }
  else {
    if ((uVar14 & 3) != 2) goto LAB_001f204e;
    iVar10 = (*((pSVar11->super_SegmentReader).arena)->_vptr_Arena[2])();
    pSVar11 = (SegmentBuilder *)CONCAT44(extraout_var,iVar10);
    if (pSVar11 != (SegmentBuilder *)0x0) {
      uVar16 = (pSVar11->super_SegmentReader).ptr.size_;
      uVar14 = (uint)(this->tag).content;
      uVar12 = (ulong)(uVar14 >> 3);
      if ((long)uVar16 < (long)(ulong)(uVar14 >> 3)) {
        uVar12 = uVar16;
      }
      uVar21 = 2 - (ulong)((uVar14 & 4) == 0);
      if (uVar16 < uVar12 + uVar21) {
LAB_001f2350:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x23c,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "\"Message contains out-of-bounds far pointer.\"",
                   (char (*) [44])"Message contains out-of-bounds far pointer.");
        goto LAB_001f2208;
      }
      pwVar6 = (pSVar11->super_SegmentReader).ptr.ptr;
      pAVar7 = (pSVar11->super_SegmentReader).arena;
      pRVar8 = (pSVar11->super_SegmentReader).readLimiter;
      uVar9 = pRVar8->limit;
      if (uVar9 < uVar21) {
        (*pAVar7->_vptr_Arena[3])();
        goto LAB_001f2350;
      }
      this = (OrphanBuilder *)(pwVar6 + uVar12);
      ppSVar1 = &this->segment;
      pRVar8->limit = uVar9 - uVar21;
      if ((uVar14 & 4) != 0) {
        iVar10 = (*pAVar7->_vptr_Arena[2])(pAVar7,(ulong)*(uint *)((long)&(this->tag).content + 4));
        pSVar11 = (SegmentBuilder *)CONCAT44(extraout_var_00,iVar10);
        if (pSVar11 == (SegmentBuilder *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x24e,FAILED,"newSegment != nullptr",
                     "\"Message contains double-far pointer to unknown segment.\"",
                     (char (*) [56])"Message contains double-far pointer to unknown segment.");
        }
        else {
          uVar14 = (uint)(this->tag).content;
          if ((uVar14 & 3) == 2) {
            uVar12 = (ulong)(uVar14 >> 3);
            uVar16 = (pSVar11->super_SegmentReader).ptr.size_;
            if ((long)uVar16 < (long)uVar12) {
              uVar12 = uVar16;
            }
            ppSVar13 = (SegmentBuilder **)((pSVar11->super_SegmentReader).ptr.ptr + uVar12);
            this = (OrphanBuilder *)ppSVar1;
            goto LAB_001f204e;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x252,FAILED,"pad->kind() == WirePointer::FAR",
                     "\"Second word of double-far pad must be far pointer.\"",
                     (char (*) [51])"Second word of double-far pad must be far pointer.");
        }
        goto LAB_001f2208;
      }
      uVar14 = (uint)(this->tag).content;
      lVar19 = (long)((int)uVar14 >> 2);
      ppSVar13 = (SegmentBuilder **)(pwVar6 + uVar16);
      if ((lVar19 < (long)pwVar6 - (long)ppSVar1 >> 3) ||
         ((long)ppSVar13 - (long)ppSVar1 >> 3 < lVar19)) goto LAB_001f205a;
      ppSVar13 = ppSVar1 + lVar19;
      goto LAB_001f205e;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x234,FAILED,"segment != nullptr",
               "\"Message contains far pointer to unknown segment.\"",
               (char (*) [49])"Message contains far pointer to unknown segment.");
  }
LAB_001f2208:
  kj::_::Debug::Fault::~Fault(&f);
LAB_001f2210:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReaderAnySize() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, ElementSize::VOID /* dummy */,
      kj::maxValue);
}